

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O0

void __thiscall
packed_gamma_file3<unsigned_int,_6UL>::flush_bits(packed_gamma_file3<unsigned_int,_6UL> *this)

{
  bool bVar1;
  size_type sVar2;
  long in_RDI;
  _Bit_iterator_base *__x;
  iterator iVar3;
  reference b;
  iterator __end2;
  iterator __begin2;
  vector<bool,_std::allocator<bool>_> *__range2;
  uint8_t x;
  int i;
  int n;
  _Bit_iterator_base *in_stack_ffffffffffffff78;
  reference local_70;
  _Bit_type *local_60;
  uint local_58;
  _Bit_type *local_50;
  uint local_48;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffdf;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffe0;
  _Bit_iterator_base *this_00;
  byte local_11;
  int local_10;
  undefined4 local_c;
  
  while( true ) {
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffffc0);
    if ((sVar2 & 7) == 0) break;
    std::vector<bool,_std::allocator<bool>_>::push_back
              (in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
  }
  __x = (_Bit_iterator_base *)(in_RDI + 0x20);
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffffc0);
  local_c = (undefined4)sVar2;
  local_10 = 0;
  local_11 = 0;
  this_00 = __x;
  std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x13b731);
  iVar3 = std::vector<bool,_std::allocator<bool>_>::end
                    ((vector<bool,_std::allocator<bool>_> *)this_00);
  local_60 = iVar3.super__Bit_iterator_base._M_p;
  local_58 = iVar3.super__Bit_iterator_base._M_offset;
  local_50 = local_60;
  local_48 = local_58;
  while( true ) {
    bVar1 = std::operator!=(__x,in_stack_ffffffffffffff78);
    if (!bVar1) break;
    local_70 = std::_Bit_iterator::operator*((_Bit_iterator *)0x13b793);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_70);
    local_11 = local_11 | bVar1 << (7U - (char)local_10 & 0x1f);
    if (local_10 == 7) {
      std::ostream::write((char *)(in_RDI + 0x298),(long)&local_11);
      local_11 = 0;
      *(long *)(in_RDI + 0x4a0) = *(long *)(in_RDI + 0x4a0) + 8;
    }
    local_10 = (local_10 + 1) % 8;
    std::_Bit_iterator::operator++((_Bit_iterator *)__x);
  }
  return;
}

Assistant:

void flush_bits(){

		//add padding
		while(bits.size()%8!=0) bits.push_back(0);

		int n = bits.size();
		int i = 0;
		uint8_t x = 0;

		for(auto b : bits){

			x |= (uint8_t(b) << (7-i));

			if(i==7){ //we just pushed last bit of a Byte

				out.write((char*)&x,1);
				x = 0;

				actual_bitsize += 8;

			}

			i = (i+1)%8;

		}

	}